

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-3.c
# Opt level: O3

int CheckerBig1(void)

{
  _Bool _Var1;
  int iVar2;
  FILE *__stream;
  char *__s;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    iVar2 = -1;
    __s = "can\'t open out.txt";
  }
  else {
    _Var1 = Check("None",0x4767,(FILE *)__stream);
    if (_Var1) {
      iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
      fclose(__stream);
      if (iVar2 == 0) {
        iVar2 = 0;
        __s = "PASSED";
        goto LAB_00102614;
      }
    }
    else {
      fclose(__stream);
    }
    iVar2 = 1;
    __s = "FAILED";
  }
LAB_00102614:
  puts(__s);
  testN = testN + 1;
  return iVar2;
}

Assistant:

static int CheckerBig1(void) {
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    bool passed = Check("None", 18279, out);
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}